

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O1

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,UInt8 u)

{
  ulong uVar1;
  ulong uVar2;
  
  if ((this->style->numberFormat).radix == '\x10') {
    sprintx(&this->ptr,(ulong)u.raw,&this->style->numberFormat,2);
  }
  else {
    uVar2 = 4;
    uVar1 = (ulong)u.raw;
    do {
      this->ptr[uVar2 - 2] = (char)uVar1 + (char)(uVar1 / 10) * -10 | 0x30;
      uVar2 = uVar2 - 1;
      uVar1 = uVar1 / 10;
    } while (1 < uVar2);
    this->ptr = this->ptr + 3;
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(UInt8 u)
{
    if (style.numberFormat.radix == 16) {
        sprintx(ptr, u.raw, style.numberFormat, 2);
    } else {
        sprintd(ptr, u.raw, 3);
    }
    return *this;
}